

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_ln.c
# Opt level: O0

cmd_ln_val_t * cmd_ln_val_init(int t,char *name,char *str)

{
  int iVar1;
  char *pcVar2;
  bool bVar3;
  int valid;
  char *e_str;
  anytype_t val;
  cmd_ln_val_t *v;
  char *str_local;
  char *name_local;
  int t_local;
  
  v = (cmd_ln_val_t *)str;
  str_local = name;
  name_local._4_4_ = t;
  if (str == (char *)0x0) {
    memset(&e_str,0,8);
  }
  else {
    bVar3 = true;
    pcVar2 = arg_resolve_env(str);
    switch(name_local._4_4_) {
    case 2:
    case 3:
      iVar1 = __isoc99_sscanf(pcVar2,"%ld",&e_str);
      bVar3 = iVar1 == 1;
      break;
    case 4:
    case 5:
      if ((pcVar2 == (char *)0x0) || (*pcVar2 == '\0')) {
        bVar3 = false;
      }
      e_str = (char *)atof_c(pcVar2);
      break;
    default:
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
              ,0x19f,"Unknown argument type: %d\n",(ulong)name_local._4_4_);
      bVar3 = false;
      break;
    case 8:
    case 9:
      e_str = __ckd_salloc__(pcVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                             ,0x199);
      break;
    case 0x10:
    case 0x11:
      if ((((*pcVar2 == 'y') || (*pcVar2 == 't')) || (*pcVar2 == 'Y')) ||
         ((*pcVar2 == 'T' || (*pcVar2 == '1')))) {
        e_str = (char *)0x1;
      }
      else if (((*pcVar2 == 'n') || (*pcVar2 == 'f')) ||
              ((*pcVar2 == 'N' || (*pcVar2 == 'F' || *pcVar2 == '0')))) {
        e_str = (char *)0x0;
      }
      else {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                ,0x193,"Unparsed boolean value \'%s\'\n",v);
        bVar3 = false;
      }
      break;
    case 0x20:
      e_str = (char *)parse_string_list(pcVar2);
    }
    ckd_free(pcVar2);
    if (!bVar3) {
      return (cmd_ln_val_t *)0x0;
    }
  }
  val.ptr = __ckd_calloc__(1,0x18,
                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                           ,0x1a8);
  *(char **)val.ptr = e_str;
  *(uint *)(val.i + 8) = name_local._4_4_;
  pcVar2 = __ckd_salloc__(str_local,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                          ,0x1ab);
  *(char **)(val.i + 0x10) = pcVar2;
  return (cmd_ln_val_t *)val.ptr;
}

Assistant:

static cmd_ln_val_t *
cmd_ln_val_init(int t, const char *name, const char *str)
{
    cmd_ln_val_t *v;
    anytype_t val;
    char *e_str;

    if (!str) {
        /* For lack of a better default value. */
        memset(&val, 0, sizeof(val));
    }
    else {
        int valid = 1;
        e_str = arg_resolve_env(str);

        switch (t) {
        case ARG_INTEGER:
        case REQARG_INTEGER:
            if (sscanf(e_str, "%ld", &val.i) != 1)
                valid = 0;
            break;
        case ARG_FLOATING:
        case REQARG_FLOATING:
            if (e_str == NULL || e_str[0] == 0)
            valid = 0;
            val.fl = atof_c(e_str);
            break;
        case ARG_BOOLEAN:
        case REQARG_BOOLEAN:
            if ((e_str[0] == 'y') || (e_str[0] == 't') ||
                (e_str[0] == 'Y') || (e_str[0] == 'T') || (e_str[0] == '1')) {
                val.i = TRUE;
            }
            else if ((e_str[0] == 'n') || (e_str[0] == 'f') ||
                     (e_str[0] == 'N') || (e_str[0] == 'F') |
                     (e_str[0] == '0')) {
                val.i = FALSE;
            }
            else {
                E_ERROR("Unparsed boolean value '%s'\n", str);
                valid = 0;
            }
            break;
        case ARG_STRING:
        case REQARG_STRING:
            val.ptr = ckd_salloc(e_str);
            break;
        case ARG_STRING_LIST:
            val.ptr = parse_string_list(e_str);
            break;
        default:
            E_ERROR("Unknown argument type: %d\n", t);
            valid = 0;
        }

        ckd_free(e_str);
        if (valid == 0)
            return NULL;
    }

    v = (cmd_ln_val_t *)ckd_calloc(1, sizeof(*v));
    memcpy(v, &val, sizeof(val));
    v->type = t;
    v->name = ckd_salloc(name);

    return v;
}